

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  Printer *pPVar1;
  long lVar2;
  bool bVar3;
  mapped_type *pmVar4;
  long lVar5;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  char *pcVar6;
  char *pcVar7;
  int i;
  long lVar8;
  Generator *this_00;
  byte bVar9;
  allocator local_261;
  Descriptor *local_260;
  long local_258;
  long local_250;
  Generator *local_248;
  string local_240;
  string options_string_1;
  DescriptorProto edp;
  string local_108;
  string options_string;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char required_function_arguments [91];
  
  bVar9 = 0;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print<>(this->printer_,"\n");
  pPVar1 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&edp,this,message_descriptor);
  io::Printer::Print<char[16],std::__cxx11::string>
            (pPVar1,"$descriptor_name$ = _descriptor.Descriptor(\n",(char (*) [16])0x39cf67,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp);
  std::__cxx11::string::~string((string *)&edp);
  io::Printer::Indent(this->printer_);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260 = message_descriptor;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&edp,"name",(allocator *)required_function_arguments);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string((string *)&edp,"full_name",(allocator *)required_function_arguments);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&edp);
  std::__cxx11::string::string((string *)&edp,"file",(allocator *)required_function_arguments);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)&edp);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&edp);
  pcVar6 = 
  "name=\'$name$\',\nfull_name=\'$full_name$\',\nfilename=None,\nfile=$file$,\ncontaining_type=None,\n"
  ;
  pcVar7 = required_function_arguments;
  for (lVar5 = 0x5b; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pcVar7 = *pcVar6;
    pcVar6 = pcVar6 + (ulong)bVar9 * -2 + 1;
    pcVar7 = pcVar7 + (ulong)bVar9 * -2 + 1;
  }
  io::Printer::Print(this->printer_,&m,required_function_arguments);
  PrintFieldsInDescriptor(this,local_260);
  PrintExtensionsInDescriptor(this,local_260);
  io::Printer::Print<>(this->printer_,"nested_types=[");
  lVar5 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(local_260 + 0x70); lVar8 = lVar8 + 1) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)&edp,this,(Descriptor *)(*(long *)(local_260 + 0x38) + lVar5));
    io::Printer::Print<char[5],std::__cxx11::string>
              (this->printer_,"$name$, ",(char (*) [5])0x38d8c6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp);
    std::__cxx11::string::~string((string *)&edp);
    lVar5 = lVar5 + 0x90;
  }
  io::Printer::Print<>(this->printer_,"],\n");
  io::Printer::Print<>(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  lVar5 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(local_260 + 0x74); lVar8 = lVar8 + 1) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((string *)&edp,this,(EnumDescriptor *)(*(long *)(local_260 + 0x40) + lVar5));
    io::Printer::Print<>
              (this->printer_,(char *)edp.super_Message.super_MessageLite._vptr_MessageLite);
    io::Printer::Print<>(this->printer_,",\n");
    std::__cxx11::string::~string((string *)&edp);
    lVar5 = lVar5 + 0x50;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,"],\n");
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString(*(MessageLite **)(local_260 + 0x20),&options_string);
  pPVar1 = this->printer_;
  OptionsValue((string *)&edp,this,&options_string);
  local_240._M_dataplus._M_p = "False";
  if (0 < *(int *)(local_260 + 0x78)) {
    local_240._M_dataplus._M_p = "True";
  }
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (&options_string_1,
             (_anonymous_namespace_ *)(ulong)*(uint *)(*(long *)(local_260 + 0x10) + 0x3c),
             (Syntax)local_260);
  io::Printer::
  Print<char[14],std::__cxx11::string,char[11],char_const*,char[7],std::__cxx11::string>
            (pPVar1,
             "serialized_options=$options_value$,\nis_extendable=$extendable$,\nsyntax=\'$syntax$\'"
             ,(char (*) [14])"options_value",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edp,
             (char (*) [11])"extendable",(char **)&local_240,(char (*) [7])0x38f730,
             &options_string_1);
  std::__cxx11::string::~string((string *)&options_string_1);
  std::__cxx11::string::~string((string *)&edp);
  io::Printer::Print<>(this->printer_,",\n");
  io::Printer::Print<>(this->printer_,"extension_ranges=[");
  lVar5 = 4;
  lVar8 = 0;
  local_248 = this;
  while (this_00 = local_248, lVar8 < *(int *)(local_260 + 0x78)) {
    lVar2 = *(long *)(local_260 + 0x48);
    pPVar1 = local_248->printer_;
    local_258 = lVar5;
    local_250 = lVar8;
    strings::AlphaNum::AlphaNum((AlphaNum *)&edp,*(int *)(lVar2 + -4 + lVar5));
    StrCat_abi_cxx11_(&local_240,(protobuf *)&edp,a);
    strings::AlphaNum::AlphaNum((AlphaNum *)&options_string_1,*(int *)(lVar2 + local_258));
    StrCat_abi_cxx11_(&local_108,(protobuf *)&options_string_1,a_00);
    io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
              (pPVar1,"($start$, $end$), ",(char (*) [6])0x39d647,&local_240,(char (*) [4])0x39d658,
               &local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_240);
    lVar5 = local_258 + 0x10;
    lVar8 = local_250 + 1;
  }
  io::Printer::Print<>(local_248->printer_,"],\n");
  io::Printer::Print<>(this_00->printer_,"oneofs=[\n");
  io::Printer::Indent(this_00->printer_);
  local_258 = 0;
  lVar5 = 0;
  while (lVar5 < *(int *)(local_260 + 0x6c)) {
    lVar8 = *(long *)(local_260 + 0x30);
    edp._internal_metadata_.
    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    .ptr_._0_4_ = 0;
    edp._has_bits_.has_bits_[0] = (uint32  [1])0x0;
    edp._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
    edp.field_.super_RepeatedPtrFieldBase.arena_ = (Arena *)&edp._internal_metadata_;
    edp.field_.super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
    local_250 = lVar5;
    edp.field_.super_RepeatedPtrFieldBase._8_8_ = edp.field_.super_RepeatedPtrFieldBase.arena_;
    std::__cxx11::string::string((string *)&options_string_1,"name",(allocator *)&local_240);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&options_string_1);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&options_string_1);
    std::__cxx11::string::string((string *)&options_string_1,"full_name",(allocator *)&local_240);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&options_string_1);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&options_string_1);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&options_string_1,
               (int)(((lVar8 - *(long *)(*(long *)(lVar8 + 0x10 + local_258) + 0x30)) + local_258) /
                    0x30));
    StrCat_abi_cxx11_(&local_240,(protobuf *)&options_string_1,a_01);
    std::__cxx11::string::string((string *)&local_108,"index",&local_261);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&edp,&local_108);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_240);
    MessageLite::SerializeAsString_abi_cxx11_
              (&local_240,*(MessageLite **)(lVar8 + 0x28 + local_258));
    this_00 = local_248;
    OptionsValue(&options_string_1,local_248,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    bVar3 = std::operator==(&options_string_1,"None");
    if (bVar3) {
      std::__cxx11::string::string
                ((string *)&local_240,"serialized_options",(allocator *)&local_108);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_240);
      std::__cxx11::string::assign((char *)pmVar4);
    }
    else {
      std::operator+(&local_240,", serialized_options=",&options_string_1);
      std::__cxx11::string::string((string *)&local_108,"serialized_options",&local_261);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&edp,&local_108);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_108);
    }
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Print(this_00->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&edp,
                       "_descriptor.OneofDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\',\n  index=$index$, containing_type=None, fields=[]$serialized_options$),\n"
                      );
    std::__cxx11::string::~string((string *)&options_string_1);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&edp);
    local_258 = local_258 + 0x30;
    lVar5 = local_250 + 1;
  }
  io::Printer::Outdent(this_00->printer_);
  io::Printer::Print<>(this_00->printer_,"],\n");
  DescriptorProto::DescriptorProto(&edp);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this_00,local_260,&edp);
  io::Printer::Outdent(this_00->printer_);
  io::Printer::Print<>(this_00->printer_,")\n");
  DescriptorProto::~DescriptorProto(&edp);
  std::__cxx11::string::~string((string *)&options_string);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<std::string, std::string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const std::string nested_name =
        ModuleLevelDescriptorName(*message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const std::string descriptor_name =
        ModuleLevelDescriptorName(*message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  std::string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "serialized_options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue(options_string), "extendable",
      message_descriptor.extension_range_count() > 0 ? "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ", "start", StrCat(range->start),
                    "end", StrCat(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<std::string, std::string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = StrCat(desc->index());
    std::string options_string =
        OptionsValue(desc->options().SerializeAsString());
    if (options_string == "None") {
      m["serialized_options"] = "";
    } else {
      m["serialized_options"] = ", serialized_options=" + options_string;
    }
    printer_->Print(m,
                    "_descriptor.OneofDescriptor(\n"
                    "  name='$name$', full_name='$full_name$',\n"
                    "  index=$index$, containing_type=None, "
                    "fields=[]$serialized_options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}